

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_lexical_analysis.cpp
# Opt level: O0

compile_errcode __thiscall
LexicalAnalysis::ParseDigit(LexicalAnalysis *this,Symbol *symbol,bool negative)

{
  uint uVar1;
  long local_50;
  SymbolName local_3c;
  byte local_36;
  byte local_35;
  int local_34;
  bool zero_flag;
  bool first_flag;
  long lStack_30;
  int number_count;
  long sum;
  Symbol *pSStack_20;
  bool negative_local;
  Symbol *symbol_local;
  LexicalAnalysis *this_local;
  
  lStack_30 = 0;
  local_34 = 0;
  local_35 = 1;
  local_36 = 0;
  sum._7_1_ = negative;
  pSStack_20 = symbol;
  symbol_local = (Symbol *)this;
  do {
    if (((local_35 & 1) != 0) && (local_35 = 0, this->ch == '0')) {
      local_36 = 1;
    }
    lStack_30 = lStack_30 * 10 + (long)this->ch + -0x30;
    local_34 = local_34 + 1;
    GetChar(this);
    uVar1 = c0_compile::isdigit((int)this->ch);
  } while ((uVar1 & 1) != 0);
  UnGetChar(this);
  if (local_34 < 10) {
    if ((sum._7_1_ & 1) == 0) {
      local_50 = lStack_30;
    }
    else {
      local_50 = -lStack_30;
    }
    lStack_30 = local_50;
    if ((-0x80000001 < local_50) && (local_50 < 0x80000000)) {
      if ((local_50 != 0) && ((local_36 & 1) != 0)) {
        return -0x7d2;
      }
      Symbol::SetLocate(pSStack_20,this->m_line_number,this->m_character_number);
      local_3c = INTERGER_SYM;
      Symbol::SetName(pSStack_20,&local_3c);
      Symbol::SetValue<int>(pSStack_20,(int)lStack_30);
      return 0;
    }
  }
  return -0x7d2;
}

Assistant:

compile_errcode LexicalAnalysis::ParseDigit(Symbol& symbol, bool negative) {
    long sum = 0;
    int number_count = 0;
    bool first_flag = true;
    bool zero_flag = false;
    do {
        if (first_flag) {
            first_flag = false;
            if (ch == '0')
                zero_flag = true;
        }
        sum = sum * 10 + ch - '0';
        number_count++;
        GetChar();
    } while (c0_compile::isdigit(ch));
    UnGetChar();
    if (number_count < 10) {
        sum = negative ? (-1*sum) : sum;
        if (sum >= INT_MIN && sum <= INT_MAX) {
            if (sum != 0 && zero_flag) {
                return INVALID_DIGIT_ERROR;  // with front zero
            }
            symbol.SetLocate(m_line_number, m_character_number);
            symbol.SetName(INTERGER_SYM);
            symbol.SetValue<int>(sum);
            return COMPILE_OK;
        }
    }
    return INVALID_DIGIT_ERROR;
}